

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

upb_MiniTable *
upb_MiniTable_BuildWithBuf
          (char *data,size_t len,upb_MiniTablePlatform platform,upb_Arena *arena,void **buf,
          size_t *buf_size,upb_Status *status)

{
  upb_MiniTable *puVar1;
  undefined1 local_148 [8];
  upb_MtDecoder decoder;
  size_t *buf_size_local;
  void **buf_local;
  upb_Arena *arena_local;
  upb_MiniTablePlatform platform_local;
  size_t len_local;
  char *data_local;
  
  decoder.arena = (upb_Arena *)buf_size;
  memset(local_148,0,0x110);
  decoder.base.end = &status->ok;
  decoder.base.err[0].__saved_mask.__val[0xf] = (unsigned_long)upb_Arena_Malloc(arena,0x18);
  decoder._232_8_ = *buf;
  decoder.vec.size = (ulong)(decoder.arena)->ptr_dont_copy_me__upb_internal_use_only / 0xc;
  decoder.fields._0_4_ = platform;
  decoder.vec.capacity = (size_t)arena;
  puVar1 = upb_MtDecoder_BuildMiniTableWithBuf
                     ((upb_MtDecoder *)local_148,data,len,buf,(size_t *)decoder.arena);
  return puVar1;
}

Assistant:

upb_MiniTable* upb_MiniTable_BuildWithBuf(const char* data, size_t len,
                                          upb_MiniTablePlatform platform,
                                          upb_Arena* arena, void** buf,
                                          size_t* buf_size,
                                          upb_Status* status) {
  upb_MtDecoder decoder = {
      .base = {.status = status},
      .platform = platform,
      .vec =
          {
              .data = *buf,
              .capacity = *buf_size / sizeof(*decoder.vec.data),
              .size = 0,
          },
      .arena = arena,
      .table = upb_Arena_Malloc(arena, sizeof(*decoder.table)),
  };

  return upb_MtDecoder_BuildMiniTableWithBuf(&decoder, data, len, buf,
                                             buf_size);
}